

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.h
# Opt level: O1

string * __thiscall
spvtools::val::ValidationState_t::SpvDecorationString_abi_cxx11_
          (string *__return_storage_ptr__,ValidationState_t *this,uint32_t decoration)

{
  spv_result_t sVar1;
  spv_operand_desc desc;
  allocator<char> local_11;
  spv_operand_desc local_10;
  
  local_10 = (spv_operand_desc)0x0;
  sVar1 = AssemblyGrammar::lookupOperand
                    (&this->grammar_,SPV_OPERAND_TYPE_DECORATION,decoration,&local_10);
  if (sVar1 == SPV_SUCCESS) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,local_10->name,&local_11);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Unknown","");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SpvDecorationString(uint32_t decoration) {
    spv_operand_desc desc = nullptr;
    if (grammar_.lookupOperand(SPV_OPERAND_TYPE_DECORATION, decoration,
                               &desc) != SPV_SUCCESS) {
      return std::string("Unknown");
    }
    return std::string(desc->name);
  }